

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O2

void handle_a_sequence_aa
               (StringBuffer *current_sequence,double *resolutions,long firstSequenceLength,
               long instance_count,bool ignore_ambigs)

{
  char *pcVar1;
  long k;
  long *plVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  lVar4 = 0;
  if (firstSequenceLength < 1) {
    firstSequenceLength = lVar4;
  }
  pcVar1 = current_sequence->sData;
  dVar5 = (double)instance_count;
  for (; lVar4 != firstSequenceLength; lVar4 = lVar4 + 1) {
    plVar2 = resolve_char(pcVar1[lVar4],true,ignore_ambigs);
    if (!ignore_ambigs) {
      dVar5 = resolution_count(pcVar1[lVar4],true);
      dVar5 = dVar5 * (double)instance_count;
    }
    for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
      resolutions[lVar3] = (double)plVar2[lVar3] * dVar5 + resolutions[lVar3];
    }
    resolutions = resolutions + 0x14;
  }
  return;
}

Assistant:

void handle_a_sequence_aa (StringBuffer& current_sequence, double * resolutions, const long firstSequenceLength, long instance_count, bool ignore_ambigs) {
    long resolution_index = 0;
    const unsigned char *s = (const unsigned char *)current_sequence.getString();
    double local_instance_count = instance_count;
    for (long c = 0; c < firstSequenceLength; c++, resolution_index+=20) {
        const long * res = resolve_char(s[c], true, ignore_ambigs);
        if (ignore_ambigs == false) {
          local_instance_count = instance_count * resolution_count(s[c], true);
        }
        for (long k = 0; k < 20; k++) {
          resolutions [resolution_index + k]   += local_instance_count*res[k];
        }
    }
}